

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O1

Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> __thiscall
Gudhi::persistence_fields::
Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
get_partial_multiplicative_identity
          (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = *productOfCharacteristics;
  if (uVar1 == 0) {
    uVar3 = 1;
  }
  else {
    this->element_ = 0;
    uVar3 = 0;
    if ((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar5 = 0;
      do {
        if (uVar1 % primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5] == 0) {
          uVar4 = partials_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
          uVar2 = uVar4 % 0x138d;
          if (uVar4 < 0x138d) {
            uVar2 = uVar4;
          }
          uVar4 = uVar3 + uVar2;
          if (CARRY4(uVar3,uVar2)) {
            uVar3 = uVar4 - 0x138d;
          }
          else {
            uVar3 = uVar4 - 0x138d;
            if (uVar4 < 0x138d) {
              uVar3 = uVar4;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) <
               (ulong)((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  this->element_ = uVar3;
  return (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>)
         (Element_conflict)this;
}

Assistant:

static Multi_field_element_with_small_characteristics get_partial_multiplicative_identity(
      const Characteristic& productOfCharacteristics) {
    if (productOfCharacteristics == 0) {
      return Multi_field_element_with_small_characteristics<minimum, maximum>(multiplicativeID_);
    }
    Multi_field_element_with_small_characteristics<minimum, maximum> mult;
    for (Characteristic idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        mult += partials_[idx];
      }
    }
    return mult;
  }